

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

bool __thiscall leveldb::MemTable::Get(MemTable *this,LookupKey *key,string *value,Status *s)

{
  int iVar1;
  Node *pNVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  uint32_t key_length;
  uint local_5c;
  Status local_58;
  Slice local_50;
  Slice local_40;
  
  local_50.data_ = key->start_;
  pNVar2 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
                     (&this->table_,&local_50.data_,(Node **)0x0);
  if (pNVar2 == (Node *)0x0) {
    return false;
  }
  pcVar3 = pNVar2->key;
  if (*pcVar3 < '\0') {
    pcVar5 = GetVarint32PtrFallback(pcVar3,pcVar3 + 5,&local_5c);
  }
  else {
    pcVar5 = pcVar3 + 1;
    local_5c = (int)*pcVar3;
  }
  local_50.size_ = (size_t)(local_5c - 8);
  local_40.data_ = key->kstart_;
  local_40.size_ = (size_t)(key->end_ + (-8 - (long)local_40.data_));
  local_50.data_ = pcVar5;
  iVar1 = (*((this->comparator_).comparator.user_comparator_)->_vptr_Comparator[2])();
  if (iVar1 == 0) {
    if (pcVar5[(ulong)local_5c - 8] == '\0') {
      local_50.data_ = "";
      local_50.size_ = 0;
      local_40.data_ = "";
      local_40.size_ = 0;
      Status::Status(&local_58,kNotFound,&local_50,&local_40);
      pcVar3 = s->state_;
      if (pcVar3 != local_58.state_) {
        if (pcVar3 != (char *)0x0) {
          operator_delete__(pcVar3);
        }
        if (local_58.state_ == (char *)0x0) {
          local_58.state_ = (char *)0x0;
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = Status::CopyState(local_58.state_);
        }
        s->state_ = pcVar3;
      }
      if (local_58.state_ != (char *)0x0) {
        operator_delete__(local_58.state_);
      }
    }
    else {
      if (pcVar5[(ulong)local_5c - 8] != '\x01') goto LAB_00110120;
      pcVar5 = pcVar5 + local_5c;
      if (*pcVar5 < '\0') {
        pcVar5 = GetVarint32PtrFallback(pcVar5,pcVar5 + 5,(uint32_t *)&local_50);
      }
      else {
        pcVar5 = pcVar5 + 1;
      }
      std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,(ulong)pcVar5)
      ;
    }
    bVar4 = true;
  }
  else {
LAB_00110120:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool MemTable::Get(const LookupKey &key, std::string *value, Status *s) {
        Slice memkey = key.memtable_key();
        Table::Iterator iter(&table_);
        iter.Seek(memkey.data());
        if (iter.Valid()) {
            // entry format is:
            //    klength  varint32
            //    userkey  char[klength]
            //    tag      uint64
            //    vlength  varint32
            //    value    char[vlength]
            // Check that it belongs to same user key.  We do not check the
            // sequence number since the Seek() call above should have skipped
            // all entries with overly large sequence numbers.
            const char *entry = iter.key();
            uint32_t key_length;
            const char *key_ptr = GetVarint32Ptr(entry, entry + 5, &key_length);
            if (comparator_.comparator.user_comparator()->Compare(
                    Slice(key_ptr, key_length - 8),
                    key.user_key()) == 0) {
                // Correct user key
                const uint64_t tag = DecodeFixed64(key_ptr + key_length - 8);
                switch (static_cast<ValueType>(tag & 0xff)) {
                    case kTypeValue: {
                        Slice v = GetLengthPrefixedSlice(key_ptr + key_length);
                        value->assign(v.data(), v.size());
                        return true;
                    }
                    case kTypeDeletion:
                        *s = Status::NotFound(Slice());
                        return true;
                }
            }
        }
        return false;
    }